

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O2

void __thiscall
AuthGameCommand::trigger
          (AuthGameCommand *this,Server *source,PlayerInfo *player,string_view parameters)

{
  undefined8 uVar1;
  size_t sVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  int iVar5;
  PlayerInfo *pPVar6;
  undefined8 *puVar7;
  char *pcVar8;
  char *extraout_RDX;
  string_view uuid;
  basic_string_view<char,_std::char_traits<char>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  undefined8 uStack_30;
  
  if (parameters._M_len == 0) {
    pcVar8 = "Error: Too few parameters. Syntax: auth <player>";
    uStack_30 = 0x30;
  }
  else {
    pPVar6 = (PlayerInfo *)
             RenX::Server::getPlayerByPartName(source,parameters._M_len,parameters._M_str);
    if (pPVar6 == (PlayerInfo *)0x0) {
      pcVar8 = "Error: Player not found.";
      uStack_30 = 0x18;
    }
    else if (pPVar6 == player) {
      pcVar8 = "Error: You can not authenticate yourself.";
      uStack_30 = 0x29;
    }
    else {
      uuid._M_str = (pPVar6->uuid)._M_dataplus._M_p;
      uuid._M_len = (pPVar6->uuid)._M_string_length;
      iVar5 = RenX_ModSystemPlugin::getConfigAccess(&pluginInstance,uuid);
      p_Var3 = pluginInstance.groups.
               super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (player->access < iVar5) {
        pcVar8 = "Error: Can\'t authenticate higher level moderators.";
        uStack_30 = 0x32;
      }
      else if (pPVar6->access == iVar5) {
        pcVar8 = "Error: Player is already authenticated";
        uStack_30 = 0x26;
      }
      else if (iVar5 < pPVar6->access) {
        pcVar8 = "Error: Player is already temporarily authenticated.";
        uStack_30 = 0x33;
      }
      else {
        iVar5 = RenX_ModSystemPlugin::auth(&pluginInstance,source,player,false,false);
        if (iVar5 == -1) {
          pcVar8 = "Error: Player failed to pass strict lock checks. Player kicked.";
          uStack_30 = 0x3f;
        }
        else {
          puVar7 = (undefined8 *)Jupiter::Plugin::getName_abi_cxx11_();
          uVar1 = Jupiter::Config::operator[](&player->varData,puVar7[1],*puVar7);
          sVar2 = Jupiter::Config::get(uVar1,5,"Group",0,0);
          __x._M_str = extraout_RDX;
          __x._M_len = sVar2;
          __y._M_str = (char *)p_Var3[6]._M_next;
          __y._M_len = (size_t)p_Var3[6]._M_prev;
          bVar4 = std::operator==(__x,__y);
          if (bVar4) {
            pcVar8 = "Error: Failed to authenticate player.";
            uStack_30 = 0x25;
          }
          else {
            pcVar8 = "Player authenticated successfully.";
            uStack_30 = 0x22;
          }
        }
      }
    }
  }
  RenX::Server::sendMessage(source,player,uStack_30,pcVar8);
  return;
}

Assistant:

void AuthGameCommand::trigger(RenX::Server *source, RenX::PlayerInfo *player, std::string_view parameters)
{
	if (!parameters.empty())
	{
		RenX::PlayerInfo *target = source->getPlayerByPartName(parameters);
		if (target == nullptr)
			source->sendMessage(*player, "Error: Player not found."sv);
		else if (target == player)
			source->sendMessage(*player, "Error: You can not authenticate yourself."sv);
		else
		{
			int cAccess = pluginInstance.getConfigAccess(target->uuid);
			if (cAccess > player->access)
				source->sendMessage(*player, "Error: Can't authenticate higher level moderators."sv);
			else if (target->access == cAccess)
				source->sendMessage(*player, "Error: Player is already authenticated"sv);
			else if (target->access > cAccess)
				source->sendMessage(*player, "Error: Player is already temporarily authenticated."sv);
			else
			{
				RenX_ModSystemPlugin::ModGroup *defaultGroup = pluginInstance.getDefaultGroup();
				if (pluginInstance.auth(*source, *player) == -1)
					source->sendMessage(*player, "Error: Player failed to pass strict lock checks. Player kicked."sv);
				else if (defaultGroup->name == player->varData[pluginInstance.getName()].get("Group"sv))
					source->sendMessage(*player, "Error: Failed to authenticate player."sv);
				else
					source->sendMessage(*player, "Player authenticated successfully."sv);
			}
		}
	}
	else
		source->sendMessage(*player, "Error: Too few parameters. Syntax: auth <player>"sv);
}